

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

void __thiscall
boost::unordered::
unordered_flat_set<slang::parsing::KnownSystemName,slang::hash<slang::parsing::KnownSystemName,void>,std::equal_to<slang::parsing::KnownSystemName>,std::allocator<slang::parsing::KnownSystemName>>
::unordered_flat_set<slang::parsing::KnownSystemName_const*>
          (unordered_flat_set<slang::parsing::KnownSystemName,slang::hash<slang::parsing::KnownSystemName,void>,std::equal_to<slang::parsing::KnownSystemName>,std::allocator<slang::parsing::KnownSystemName>>
           *this,KnownSystemName *first,KnownSystemName *last,size_type n,hasher *h,key_equal *pred,
          allocator_type *a)

{
  detail::foa::
  table_core<boost::unordered::detail::foa::flat_set_types<slang::parsing::KnownSystemName>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::parsing::KnownSystemName,_void>,_std::equal_to<slang::parsing::KnownSystemName>,_std::allocator<slang::parsing::KnownSystemName>_>
  ::table_core((table_core<boost::unordered::detail::foa::flat_set_types<slang::parsing::KnownSystemName>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<slang::parsing::KnownSystemName,_void>,_std::equal_to<slang::parsing::KnownSystemName>,_std::allocator<slang::parsing::KnownSystemName>_>
                *)this,n,h,pred,a);
  insert<slang::parsing::KnownSystemName_const*>(this,first,last);
  return;
}

Assistant:

unordered_flat_set(Iterator first, Iterator last, size_type n = 0, hasher const& h = hasher(),
                       key_equal const& pred = key_equal(),
                       allocator_type const& a = allocator_type()) :
        unordered_flat_set(n, h, pred, a) {
        this->insert(first, last);
    }